

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O1

void mafilter(double *sig,int N,int window,double *oup)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  void *__ptr;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  void *pvVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  uVar11 = window - (window >> 0x1f);
  uVar3 = uVar11 & 0xfffffffe;
  if (uVar3 != window) {
    uVar11 = (window - (window + -1 >> 0x1f)) - 1;
  }
  uVar11 = (int)uVar11 >> 1;
  lVar9 = (long)(int)(N + uVar11 * 2);
  __ptr = malloc(lVar9 * 8);
  if (0 < (int)uVar11) {
    dVar13 = *sig;
    uVar5 = 0;
    do {
      *(double *)((long)__ptr + uVar5 * 8) = dVar13;
      uVar5 = uVar5 + 1;
    } while (uVar11 != uVar5);
  }
  uVar10 = uVar11 * 2;
  iVar6 = uVar11 + N;
  if (0 < N) {
    iVar2 = uVar11 + 1;
    if ((int)(uVar11 + 1) < iVar6) {
      iVar2 = iVar6;
    }
    memcpy((void *)((long)__ptr + (long)(int)uVar11 * 8),sig,(ulong)(~uVar11 + iVar2) * 8 + 8);
  }
  if ((int)uVar11 < (int)uVar10) {
    dVar13 = sig[(long)N + -1];
    lVar4 = (long)iVar6;
    do {
      *(double *)((long)__ptr + lVar4 * 8) = dVar13;
      lVar4 = lVar4 + 1;
    } while (lVar4 < lVar9);
  }
  if (uVar3 == window) {
    if (0 < N) {
      uVar3 = uVar10 | 1;
      lVar4 = (long)(int)uVar11;
      lVar7 = 0;
      pvVar8 = __ptr;
      lVar9 = lVar4;
      do {
        dVar13 = 0.0;
        if (lVar9 - lVar4 <= lVar9 + lVar4) {
          dVar13 = 0.0;
          lVar12 = 0;
          do {
            dVar1 = *(double *)((long)pvVar8 + lVar12 * 8);
            dVar14 = dVar1 * 0.5 + dVar13;
            dVar15 = dVar14;
            if ((ulong)uVar10 + lVar7 != lVar12) {
              dVar15 = dVar13 + dVar1;
            }
            dVar13 = dVar14;
            if (lVar12 != 0) {
              dVar13 = dVar15;
            }
            lVar12 = lVar12 + 1;
          } while ((ulong)uVar3 + lVar7 != lVar12);
        }
        oup[lVar9 - lVar4] = dVar13 / (double)window;
        lVar9 = lVar9 + 1;
        uVar3 = uVar3 + 1;
        pvVar8 = (void *)((long)pvVar8 + 8);
        lVar7 = lVar7 + -1;
        uVar10 = uVar10 + 1;
      } while (lVar9 < iVar6);
    }
  }
  else if (0 < N) {
    uVar10 = uVar10 | 1;
    lVar4 = (long)(int)uVar11;
    lVar7 = 0;
    pvVar8 = __ptr;
    lVar9 = lVar4;
    do {
      dVar13 = 0.0;
      if (lVar9 - lVar4 <= lVar9 + lVar4) {
        lVar12 = 0;
        do {
          dVar13 = dVar13 + *(double *)((long)pvVar8 + lVar12 * 8);
          lVar12 = lVar12 + 1;
        } while ((ulong)uVar10 + lVar7 != lVar12);
      }
      oup[lVar9 - lVar4] = dVar13 / (double)window;
      lVar9 = lVar9 + 1;
      uVar10 = uVar10 + 1;
      pvVar8 = (void *)((long)pvVar8 + 8);
      lVar7 = lVar7 + -1;
    } while (lVar9 < iVar6);
  }
  free(__ptr);
  return;
}

Assistant:

void mafilter(double *sig,int N, int window,double *oup) {
	int odd,q,N2,i,j;
	double sum;
	double *temp;
	/*
	 * mafilter is a moving average filter that smoothes the signal using
	 * a smoothing window. In this implementation, the signal is extended
	 * by the length of the window. Length floor(window/2) extension is carried
	 * out at the beginning of the signal by setting values of the signal
	 * to sig[0]. The rest of the extension is done at the tail of the signal
	 * by setting it equal to sig[N-1].
	 *
	 */
	
	odd = window - ((window/2) * 2);
	
	if (odd) {
		q = (window - 1 ) / 2; 
	} else {
		q = window / 2;
	}
	
	N2 = N + (2 * q);
	
	temp = (double*) malloc (sizeof(double) * N2);
	
	for (i = 0; i < q; ++i) {
		temp[i] = sig[0];
	}
	
	for (i = q; i < N + q; ++i) {
		temp[i] = sig[i - q];
	}
	
	for (i = N + q; i < N2; ++i) {
		temp[i] = sig[N-1];
	}
	
	if (odd) {
		for (i = q; i < N+q; ++i) {
			sum = 0.0;
			for (j = i - q; j < i + q + 1;j++) {
				sum += temp[j];
			}
			oup[i-q] = sum /window;
		}  
	} else {
		for (i = q; i < N+q; ++i) {
			sum = 0.0;
			for (j = i - q; j < i + q + 1;j++) {
				if ( j == i - q || j == i + q) {
					sum += 0.5 * temp[j];
				} else {
					sum += temp[j];
				}
			}
			oup[i-q] = sum /window;
		}  
	}
	
	
	free(temp);
}